

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::fileOrderComparator(TestCase *lhs,TestCase *rhs)

{
  int iVar1;
  String *in_RSI;
  String *in_RDI;
  int res;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  iVar1 = String::compare(in_RDI,in_RSI,SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
  if (iVar1 == 0) {
    if (*(int *)&in_RDI[1].field_0 == *(int *)&in_RSI[1].field_0) {
      local_1 = *(int *)&in_RDI[4].field_0 < *(int *)&in_RSI[4].field_0;
    }
    else {
      local_1 = *(uint *)&in_RDI[1].field_0 < *(uint *)&in_RSI[1].field_0;
    }
  }
  else {
    local_1 = iVar1 < 0;
  }
  return local_1;
}

Assistant:

bool fileOrderComparator(const TestCase* lhs, const TestCase* rhs) {
        // this is needed because MSVC gives different case for drive letters
        // for __FILE__ when evaluated in a header and a source file
        const int res = lhs->m_file.compare(rhs->m_file, bool(DOCTEST_MSVC));
        if(res != 0)
            return res < 0;
        if(lhs->m_line != rhs->m_line)
            return lhs->m_line < rhs->m_line;
        return lhs->m_template_id < rhs->m_template_id;
    }